

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg-queue.c
# Opt level: O2

_Bool ndn_msgqueue_empty(void)

{
  ndn_msg_t *pnVar1;
  ndn_msg_t *pnVar2;
  
  pnVar1 = ptail;
  while ((pnVar2 = pfront, pfront->func == (ndn_msg_callback)0xffffffffffffffff && (pfront != ptail)
         )) {
    pfront = (ndn_msg_t *)((long)&pfront->obj + pfront->length);
    if ((ndn_msg_t *)(msg_queue + 0xfff) < pfront) {
      pfront = (ndn_msg_t *)msg_queue;
    }
  }
  if (pfront == ptail) {
    psplit = (ndn_msg_t *)msg_queue;
    ptail = (ndn_msg_t *)msg_queue;
    pfront = (ndn_msg_t *)msg_queue;
  }
  return pnVar2 == pnVar1;
}

Assistant:

bool
ndn_msgqueue_empty(void) {
  while(pfront->func == NDN_MSG_PADDING && pfront != ptail){
    MSGQUEUE_NEXT(pfront);
  }
  if(pfront == ptail){
    // defrag when empty
    pfront = ptail = psplit = (ndn_msg_t*)&msg_queue[0];
    return true;
  } else
    return false;
}